

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O1

int debug_lock_lock(uint mode,void *lock_)

{
  int iVar1;
  debug_lock *lock;
  ulong uVar2;
  
  uVar2 = (ulong)mode;
  lock = (debug_lock *)lock_;
  if ((*(byte *)((long)lock_ + 4) & 2) == 0) {
    if ((mode & 0xc) == 0) goto LAB_00235677;
    debug_lock_lock_cold_2();
  }
  mode = (uint)uVar2;
  if ((uVar2 & 0xc) == 0) {
    debug_lock_lock_cold_1();
  }
LAB_00235677:
  if (original_lock_fns_.lock == (_func_int_uint_void_ptr *)0x0) {
    iVar1 = 0;
  }
  else {
    lock = *(debug_lock **)((long)lock_ + 0x18);
    iVar1 = (*original_lock_fns_.lock)(mode,lock);
  }
  if (iVar1 == 0) {
    evthread_debug_lock_mark_locked((uint)lock_,lock);
  }
  return iVar1;
}

Assistant:

static int
debug_lock_lock(unsigned mode, void *lock_)
{
	struct debug_lock *lock = lock_;
	int res = 0;
	if (lock->locktype & EVTHREAD_LOCKTYPE_READWRITE)
		EVUTIL_ASSERT(mode & (EVTHREAD_READ|EVTHREAD_WRITE));
	else
		EVUTIL_ASSERT((mode & (EVTHREAD_READ|EVTHREAD_WRITE)) == 0);
	if (original_lock_fns_.lock)
		res = original_lock_fns_.lock(mode, lock->lock);
	if (!res) {
		evthread_debug_lock_mark_locked(mode, lock);
	}
	return res;
}